

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

void Abc_NtkDfs_iter(Vec_Ptr_t *vStack,Abc_Obj_t *pRoot,Vec_Ptr_t *vNodes)

{
  int *piVar1;
  void ***pppvVar2;
  int *piVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  void *pvVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  void **ppvVar11;
  void ***pppvVar12;
  void ***pppvVar13;
  int *piVar14;
  int Fill;
  uint uVar15;
  int Fill_00;
  int iVar16;
  long *plVar17;
  
  pAVar4 = pRoot->pNtk;
  iVar16 = pRoot->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar16 + 1,(int)vNodes);
  if (((long)iVar16 < 0) || ((pAVar4->vTravIds).nSize <= iVar16)) {
LAB_001c1794:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pRoot->pNtk;
  iVar10 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar16] == iVar10) {
    return;
  }
  iVar16 = pRoot->Id;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar16 + 1,Fill);
  if (((long)iVar16 < 0) || ((pAVar5->vTravIds).nSize <= iVar16)) {
LAB_001c17f1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar5->vTravIds).pArray[iVar16] = iVar10;
  uVar9 = *(uint *)&pRoot->field_0x14 & 0xf;
  if (uVar9 == 2) {
    return;
  }
  if (uVar9 == 5) {
    return;
  }
  if (pRoot->pNtk->ntkType == ABC_NTK_STRASH) {
    if (**(int **)((ulong)pRoot & 0xfffffffffffffffe) != 3) {
LAB_001c1810:
      __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                    ,0x18d,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
    }
    if ((*(uint *)((long)((ulong)pRoot & 0xfffffffffffffffe) + 0x14) & 0xf) == 1) {
      return;
    }
  }
  vStack->nSize = 0;
  if (vStack->nCap == 0) {
    if (vStack->pArray == (void **)0x0) {
      ppvVar11 = (void **)malloc(0x80);
    }
    else {
      ppvVar11 = (void **)realloc(vStack->pArray,0x80);
    }
    vStack->pArray = ppvVar11;
    vStack->nCap = 0x10;
  }
  piVar1 = &vStack->nSize;
  pppvVar2 = &vStack->pArray;
  iVar16 = vStack->nSize;
  uVar15 = iVar16 + 1;
  vStack->nSize = uVar15;
  vStack->pArray[iVar16] = pRoot;
  uVar9 = vStack->nCap;
  if (uVar15 == uVar9) {
    if ((int)uVar9 < 0x10) {
      if (*pppvVar2 == (void **)0x0) {
        ppvVar11 = (void **)malloc(0x80);
      }
      else {
        ppvVar11 = (void **)realloc(*pppvVar2,0x80);
      }
      iVar16 = 0x10;
    }
    else {
      iVar16 = uVar9 * 2;
      if (iVar16 <= (int)uVar9) goto LAB_001c135a;
      if (*pppvVar2 == (void **)0x0) {
        ppvVar11 = (void **)malloc((ulong)uVar9 << 4);
      }
      else {
        ppvVar11 = (void **)realloc(*pppvVar2,(ulong)uVar9 << 4);
      }
    }
    vStack->pArray = ppvVar11;
    vStack->nCap = iVar16;
  }
LAB_001c135a:
  iVar16 = *piVar1;
  iVar10 = iVar16 + 1;
  *piVar1 = iVar10;
  (*pppvVar2)[iVar16] = (void *)0x0;
  if (-1 < (long)iVar16) {
    piVar3 = &vNodes->nSize;
    pppvVar13 = &vNodes->pArray;
    do {
      ppvVar11 = *pppvVar2;
      *piVar1 = iVar10 - 1U;
      if (iVar10 == 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      pvVar6 = ppvVar11[iVar10 - 1U];
      uVar9 = iVar10 - 2;
      *piVar1 = uVar9;
      plVar17 = (long *)ppvVar11[uVar9];
      if ((*(uint *)((long)plVar17 + 0x14) & 0xf) == 6) {
        __assert_fail("!Abc_ObjIsNet(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x218,"void Abc_NtkDfs_iter(Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)");
      }
      iVar16 = (int)pvVar6;
      if (*(int *)((long)plVar17 + 0x1c) == iVar16) {
        uVar9 = vNodes->nCap;
        pppvVar12 = pppvVar13;
        piVar14 = piVar3;
        if (vNodes->nSize == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar11;
            iVar16 = 0x10;
          }
          else {
            iVar16 = uVar9 * 2;
            if (iVar16 <= (int)uVar9) goto LAB_001c1667;
            if (vNodes->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar9 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(vNodes->pArray,(ulong)uVar9 << 4);
            }
            vNodes->pArray = ppvVar11;
          }
          vNodes->nCap = iVar16;
        }
LAB_001c1667:
        ppvVar11 = *pppvVar12;
        iVar16 = *piVar14;
        *piVar14 = iVar16 + 1;
        ppvVar11[iVar16] = plVar17;
      }
      else {
        uVar15 = vStack->nCap;
        if (uVar9 == uVar15) {
          if ((int)uVar15 < 0x10) {
            if (ppvVar11 == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(ppvVar11,0x80);
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar15 * 2;
            if (iVar10 <= (int)uVar15) goto LAB_001c1499;
            if (ppvVar11 == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar15 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(ppvVar11,(ulong)uVar15 << 4);
            }
          }
          vStack->pArray = ppvVar11;
          vStack->nCap = iVar10;
        }
LAB_001c1499:
        iVar10 = vStack->nSize;
        uVar15 = iVar10 + 1;
        vStack->nSize = uVar15;
        vStack->pArray[iVar10] = plVar17;
        uVar9 = vStack->nCap;
        if (uVar15 == uVar9) {
          if ((int)uVar9 < 0x10) {
            if (*pppvVar2 == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(*pppvVar2,0x80);
            }
            iVar10 = 0x10;
          }
          else {
            iVar10 = uVar9 * 2;
            if (iVar10 <= (int)uVar9) goto LAB_001c150f;
            if (*pppvVar2 == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar9 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(*pppvVar2,(ulong)uVar9 << 4);
            }
          }
          vStack->pArray = ppvVar11;
          vStack->nCap = iVar10;
        }
LAB_001c150f:
        iVar10 = *piVar1;
        *piVar1 = iVar10 + 1;
        (*pppvVar2)[iVar10] = (void *)(long)(iVar16 + 1);
        plVar17 = *(long **)(*(long *)(*(long *)(*plVar17 + 0x20) + 8) +
                            (long)*(int *)(plVar17[4] + (long)iVar16 * 4) * 8);
        if (*(int *)*plVar17 == 1) {
          plVar17 = *(long **)(*(long *)(*(long *)((int *)*plVar17 + 8) + 8) +
                              (long)*(int *)plVar17[4] * 8);
        }
        lVar7 = *plVar17;
        iVar10 = (int)plVar17[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar7 + 0xe0),iVar10 + 1,iVar16);
        if (((long)iVar10 < 0) || (*(int *)(lVar7 + 0xe4) <= iVar10)) goto LAB_001c1794;
        lVar8 = *plVar17;
        iVar16 = *(int *)(lVar8 + 0xd8);
        if (*(int *)(*(long *)(lVar7 + 0xe8) + (long)iVar10 * 4) != iVar16) {
          iVar10 = (int)plVar17[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar8 + 0xe0),iVar10 + 1,Fill_00);
          if (((long)iVar10 < 0) || (*(int *)(lVar8 + 0xe4) <= iVar10)) goto LAB_001c17f1;
          *(int *)(*(long *)(lVar8 + 0xe8) + (long)iVar10 * 4) = iVar16;
          uVar9 = *(uint *)((long)plVar17 + 0x14) & 0xf;
          if ((uVar9 != 2) && (uVar9 != 5)) {
            if (*(int *)*plVar17 == 3) {
              if (**(int **)((ulong)plVar17 & 0xfffffffffffffffe) != 3) goto LAB_001c1810;
              if ((*(uint *)((long)((ulong)plVar17 & 0xfffffffffffffffe) + 0x14) & 0xf) == 1)
              goto LAB_001c1676;
            }
            uVar9 = vStack->nCap;
            if (vStack->nSize == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*pppvVar2 == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(*pppvVar2,0x80);
                }
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar9 * 2;
                if (iVar16 <= (int)uVar9) goto LAB_001c16df;
                if (*pppvVar2 == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar9 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(*pppvVar2,(ulong)uVar9 << 4);
                }
              }
              vStack->pArray = ppvVar11;
              vStack->nCap = iVar16;
            }
LAB_001c16df:
            iVar16 = vStack->nSize;
            uVar15 = iVar16 + 1;
            vStack->nSize = uVar15;
            vStack->pArray[iVar16] = plVar17;
            uVar9 = vStack->nCap;
            if (uVar15 == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (*pppvVar2 == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(*pppvVar2,0x80);
                }
                iVar16 = 0x10;
              }
              else {
                iVar16 = uVar9 * 2;
                if (iVar16 <= (int)uVar9) goto LAB_001c1751;
                if (*pppvVar2 == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar9 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(*pppvVar2,(ulong)uVar9 << 4);
                }
              }
              vStack->pArray = ppvVar11;
              vStack->nCap = iVar16;
            }
LAB_001c1751:
            plVar17 = (long *)0x0;
            pppvVar12 = pppvVar2;
            piVar14 = piVar1;
            goto LAB_001c1667;
          }
        }
      }
LAB_001c1676:
      iVar10 = *piVar1;
    } while (0 < iVar10);
  }
  return;
}

Assistant:

void Abc_NtkDfs_iter( Vec_Ptr_t * vStack, Abc_Obj_t * pRoot, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode, * pFanin;
    int iFanin;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pRoot ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pRoot );
    // skip the CI
    if ( Abc_ObjIsCi(pRoot) || (Abc_NtkIsStrash(pRoot->pNtk) && Abc_AigNodeIsConst(pRoot)) )
        return;
    // add the CI
    Vec_PtrClear( vStack );
    Vec_PtrPush( vStack, pRoot );
    Vec_PtrPush( vStack, (void *)0 );
    while ( Vec_PtrSize(vStack) > 0 )
    {
        // get the node and its fanin
        iFanin = (int)(ABC_PTRINT_T)Vec_PtrPop(vStack);
        pNode  = (Abc_Obj_t *)Vec_PtrPop(vStack);
        assert( !Abc_ObjIsNet(pNode) );
        // add it to the array of nodes if we finished
        if ( iFanin == Abc_ObjFaninNum(pNode) )
        {
            Vec_PtrPush( vNodes, pNode );
            continue;
        }
        // explore the next fanin
        Vec_PtrPush( vStack, pNode );
        Vec_PtrPush( vStack, (void *)(ABC_PTRINT_T)(iFanin+1) );
        // get the fanin
        pFanin = Abc_ObjFanin0Ntk( Abc_ObjFanin(pNode,iFanin) );
        // if this node is already visited, skip
        if ( Abc_NodeIsTravIdCurrent( pFanin ) )
            continue;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pFanin );
        // skip the CI
        if ( Abc_ObjIsCi(pFanin) || (Abc_NtkIsStrash(pFanin->pNtk) && Abc_AigNodeIsConst(pFanin)) )
            continue;
        Vec_PtrPush( vStack, pFanin );
        Vec_PtrPush( vStack, (void *)0 );   
    }
}